

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise.c
# Opt level: O3

double sampleOctaveAmp(OctaveNoise *noise,double x,double y,double z,double yamp,double ymin,
                      int ydefault)

{
  PerlinNoise *noise_00;
  long lVar1;
  double dVar2;
  double dVar3;
  double d2;
  
  lVar1 = (long)noise->octcnt;
  if (lVar1 < 1) {
    dVar2 = 0.0;
  }
  else {
    noise_00 = noise->octaves;
    dVar2 = 0.0;
    do {
      dVar3 = noise_00->lacunarity;
      if (ydefault == 0) {
        d2 = dVar3 * y;
      }
      else {
        d2 = -noise_00->b;
      }
      dVar3 = samplePerlin(noise_00,dVar3 * x,d2,dVar3 * z,dVar3 * yamp,dVar3 * ymin);
      dVar2 = dVar2 + dVar3 * noise_00->amplitude;
      noise_00 = noise_00 + 1;
      lVar1 = lVar1 + -1;
    } while (lVar1 != 0);
  }
  return dVar2;
}

Assistant:

double sampleOctaveAmp(const OctaveNoise *noise, double x, double y, double z,
        double yamp, double ymin, int ydefault)
{
    double v = 0;
    int i;
    for (i = 0; i < noise->octcnt; i++)
    {
        PerlinNoise *p = noise->octaves + i;
        double lf = p->lacunarity;
        double ax = maintainPrecision(x * lf);
        double ay = ydefault ? -p->b : maintainPrecision(y * lf);
        double az = maintainPrecision(z * lf);
        double pv = samplePerlin(p, ax, ay, az, yamp * lf, ymin * lf);
        v += p->amplitude * pv;
    }
    return v;
}